

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void init::SetLoggingOptions(ArgsManager *args)

{
  bool bVar1;
  Logger *pLVar2;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff38;
  undefined1 local_90 [32];
  path local_70;
  path local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-debuglogfile",(allocator<char> *)(local_90 + 0x20));
  bVar1 = ArgsManager::IsArgNegated(args,&local_48._M_pathname);
  pLVar2 = LogInstance();
  pLVar2->m_print_to_file = !bVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"-debuglogfile",(allocator<char> *)&stack0xffffffffffffff47);
  fs::path::path((path *)&stack0xffffffffffffff48,"debug.log");
  ArgsManager::GetPathArg((path *)(local_90 + 0x20),args,in_stack_ffffffffffffff38,(path *)local_90)
  ;
  AbsPathForConfigVal((path *)&local_48,args,(path *)(local_90 + 0x20),true);
  pLVar2 = LogInstance();
  std::filesystem::__cxx11::path::operator=(&(pLVar2->m_file_path).super_path,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path((path *)(local_90 + 0x20));
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-printtoconsole",(allocator<char> *)&stack0xffffffffffffff48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_90 + 0x20),"-daemon",(allocator<char> *)&stack0xffffffffffffff47);
  bVar1 = ArgsManager::GetBoolArg(args,(string *)(local_90 + 0x20),false);
  bVar1 = ArgsManager::GetBoolArg(args,&local_48._M_pathname,!bVar1);
  pLVar2 = LogInstance();
  pLVar2->m_print_to_console = bVar1;
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-logtimestamps",(allocator<char> *)(local_90 + 0x20));
  bVar1 = ArgsManager::GetBoolArg(args,&local_48._M_pathname,true);
  pLVar2 = LogInstance();
  pLVar2->m_log_timestamps = bVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-logtimemicros",(allocator<char> *)(local_90 + 0x20));
  bVar1 = ArgsManager::GetBoolArg(args,&local_48._M_pathname,false);
  pLVar2 = LogInstance();
  pLVar2->m_log_time_micros = bVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-logthreadnames",(allocator<char> *)(local_90 + 0x20));
  bVar1 = ArgsManager::GetBoolArg(args,&local_48._M_pathname,false);
  pLVar2 = LogInstance();
  pLVar2->m_log_threadnames = bVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-logsourcelocations",(allocator<char> *)(local_90 + 0x20));
  bVar1 = ArgsManager::GetBoolArg(args,&local_48._M_pathname,false);
  pLVar2 = LogInstance();
  pLVar2->m_log_sourcelocations = bVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-loglevelalways",(allocator<char> *)(local_90 + 0x20));
  bVar1 = ArgsManager::GetBoolArg(args,&local_48._M_pathname,false);
  pLVar2 = LogInstance();
  pLVar2->m_always_print_category_level = bVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-logips",(allocator<char> *)(local_90 + 0x20));
  fLogIPs = ArgsManager::GetBoolArg(args,&local_48._M_pathname,false);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetLoggingOptions(const ArgsManager& args)
{
    LogInstance().m_print_to_file = !args.IsArgNegated("-debuglogfile");
    LogInstance().m_file_path = AbsPathForConfigVal(args, args.GetPathArg("-debuglogfile", DEFAULT_DEBUGLOGFILE));
    LogInstance().m_print_to_console = args.GetBoolArg("-printtoconsole", !args.GetBoolArg("-daemon", false));
    LogInstance().m_log_timestamps = args.GetBoolArg("-logtimestamps", DEFAULT_LOGTIMESTAMPS);
    LogInstance().m_log_time_micros = args.GetBoolArg("-logtimemicros", DEFAULT_LOGTIMEMICROS);
    LogInstance().m_log_threadnames = args.GetBoolArg("-logthreadnames", DEFAULT_LOGTHREADNAMES);
    LogInstance().m_log_sourcelocations = args.GetBoolArg("-logsourcelocations", DEFAULT_LOGSOURCELOCATIONS);
    LogInstance().m_always_print_category_level = args.GetBoolArg("-loglevelalways", DEFAULT_LOGLEVELALWAYS);

    fLogIPs = args.GetBoolArg("-logips", DEFAULT_LOGIPS);
}